

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleVar(ImGuiStyleVar idx,float val)

{
  int iVar1;
  uint uVar2;
  ImGuiStyleMod *pIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiStyleMod *__dest;
  int iVar6;
  int iVar7;
  
  pIVar4 = GImGui;
  if (0x14 < (uint)idx) {
    __assert_fail("idx >= 0 && idx < ImGuiStyleVar_COUNT",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x1a90,"const ImGuiStyleVarInfo *GetStyleVarInfo(ImGuiStyleVar)");
  }
  if (GStyleVarInfo[(uint)idx].Count == 1) {
    uVar2 = GStyleVarInfo[(uint)idx].Offset;
    iVar1 = *(int *)((long)&(GImGui->Style).Alpha + (ulong)uVar2);
    iVar5 = (GImGui->StyleModifiers).Size;
    if (iVar5 == (GImGui->StyleModifiers).Capacity) {
      if (iVar5 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar5 / 2 + iVar5;
      }
      iVar7 = iVar5 + 1;
      if (iVar5 + 1 < iVar6) {
        iVar7 = iVar6;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (ImGuiStyleMod *)(*GImAllocatorAllocFunc)((long)iVar7 * 0xc,GImAllocatorUserData);
      pIVar3 = (pIVar4->StyleModifiers).Data;
      if (pIVar3 != (ImGuiStyleMod *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar4->StyleModifiers).Size * 0xc);
        pIVar3 = (pIVar4->StyleModifiers).Data;
        if (pIVar3 != (ImGuiStyleMod *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar4->StyleModifiers).Data = __dest;
      (pIVar4->StyleModifiers).Capacity = iVar7;
      iVar5 = (pIVar4->StyleModifiers).Size;
    }
    else {
      __dest = (GImGui->StyleModifiers).Data;
    }
    __dest[iVar5].VarIdx = idx;
    __dest[iVar5].field_1.BackupInt[0] = iVar1;
    (pIVar4->StyleModifiers).Size = (pIVar4->StyleModifiers).Size + 1;
    *(float *)((long)&(pIVar4->Style).Alpha + (ulong)uVar2) = val;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1aa0,"void ImGui::PushStyleVar(ImGuiStyleVar, float)");
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_COUNT);
    IM_ASSERT(IM_ARRAYSIZE(GStyleVarInfo) == ImGuiStyleVar_COUNT);
    return &GStyleVarInfo[idx];
}